

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_new_map_format.hpp
# Opt level: O1

uint32_t PatchNewMapFormat::inject_func_load_data_block(ROM *rom)

{
  uint32_t uVar1;
  initializer_list<md::DataRegister> __l;
  initializer_list<md::AddressRegister> __l_00;
  initializer_list<md::DataRegister> __l_01;
  initializer_list<md::AddressRegister> __l_02;
  AddressInRegister ret;
  Code func;
  allocator_type local_182;
  allocator_type local_181;
  undefined1 local_180 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  undefined **local_160;
  undefined1 local_158;
  undefined **local_150;
  undefined1 local_148;
  undefined **local_140;
  undefined1 local_138;
  undefined **local_130;
  undefined1 local_128;
  undefined **local_120;
  undefined1 local_118;
  undefined **local_110;
  undefined1 local_108;
  vector<md::DataRegister,_std::allocator<md::DataRegister>_> local_100;
  Code local_e8;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_68;
  AddressRegister local_50;
  AddressRegister local_40;
  
  local_e8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_e8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
  local_e8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_e8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_e8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_e8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_e8._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  local_e8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_e8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_e8._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_180._8_8_ = local_180._8_8_ & 0xffffffffffffff00;
  local_180._0_8_ = &PTR_getXn_00261bb0;
  local_170._M_local_buf[8] = 1;
  local_170._M_allocated_capacity = (size_type)&PTR_getXn_00261bb0;
  local_158 = 2;
  local_160 = &PTR_getXn_00261bb0;
  local_148 = 3;
  local_150 = &PTR_getXn_00261bb0;
  local_138 = 4;
  local_140 = &PTR_getXn_00261bb0;
  local_128 = 5;
  local_130 = &PTR_getXn_00261bb0;
  local_118 = 6;
  local_120 = &PTR_getXn_00261bb0;
  local_108 = 7;
  local_110 = &PTR_getXn_00261bb0;
  __l._M_len = 8;
  __l._M_array = (iterator)local_180;
  local_e8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_e8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_e8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_e8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            (&local_100,__l,&local_181);
  local_50.super_Register._code = '\x03';
  local_50.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261c50;
  __l_00._M_len = 1;
  __l_00._M_array = &local_50;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            (&local_68,__l_00,&local_182);
  local_40.super_Register._code = '\a';
  local_40.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261c50;
  md::Code::movem(&local_e8,&local_100,&local_68,true,&local_40,LONG);
  if (local_68.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100.
                    super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_100.
                          super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_100.
                          super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_180[8] = '\x01';
  local_180._0_8_ = &PTR_getXn_00261bb0;
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 1;
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261c50;
  md::Code::adda(&local_e8,(Param *)local_180,(AddressRegister *)&local_100);
  local_180._0_8_ = &local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"line","");
  md::Code::label(&local_e8,(string *)local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._0_8_ != &local_170) {
    operator_delete((void *)local_180._0_8_,local_170._M_allocated_capacity + 1);
  }
  local_180[8] = '\x01';
  local_180._0_8_ = &PTR_getXn_00261c50;
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 3;
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261c50;
  md::Code::move(&local_e8,(Param *)local_180,(Param *)&local_100,LONG);
  local_180[8] = '\x02';
  local_180._0_8_ = &PTR_getXn_00261bb0;
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 1;
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261c50;
  md::Code::adda(&local_e8,(Param *)local_180,(AddressRegister *)&local_100);
  local_180[8] = '\x03';
  local_180._0_8_ = &PTR_getXn_00261bb0;
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261bb0;
  md::Code::move(&local_e8,(Param *)local_180,(Param *)&local_100,WORD);
  local_180._0_8_ = &local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"loop","");
  md::Code::label(&local_e8,(string *)local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._0_8_ != &local_170) {
    operator_delete((void *)local_180._0_8_,local_170._M_allocated_capacity + 1);
  }
  local_180[8] = '\x05';
  local_180._0_8_ = &PTR_getXn_00261bb0;
  md::Code::tst(&local_e8,(Param *)local_180,WORD);
  local_180._0_8_ = &local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"skip","");
  md::Code::bne(&local_e8,(string *)local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._0_8_ != &local_170) {
    operator_delete((void *)local_180._0_8_,local_170._M_allocated_capacity + 1);
  }
  local_180[8] = '\x04';
  local_180._0_8_ = &PTR_getXn_00261bb0;
  md::Code::tst(&local_e8,(Param *)local_180,WORD);
  local_180._0_8_ = &local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"repeat","");
  md::Code::bne(&local_e8,(string *)local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._0_8_ != &local_170) {
    operator_delete((void *)local_180._0_8_,local_170._M_allocated_capacity + 1);
  }
  local_180._0_8_ = &PTR_getXn_00261d18;
  local_170._M_allocated_capacity = local_170._M_allocated_capacity & 0xffffffffffffff00;
  local_180._8_8_ = &PTR_getXn_00261c50;
  local_170._8_2_ = 0;
  local_170._M_local_buf[10] = '\x03';
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 7;
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261bb0;
  md::Code::move(&local_e8,(Param *)local_180,(Param *)&local_100,WORD);
  local_180._0_8_ = &local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"minus_case","");
  md::Code::bmi(&local_e8,(string *)local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._0_8_ != &local_170) {
    operator_delete((void *)local_180._0_8_,local_170._M_allocated_capacity + 1);
  }
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 7;
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261bb0;
  local_180._0_8_ = &PTR_getXn_00261d18;
  local_170._M_local_buf[0] = 1;
  local_180._8_8_ = &PTR_getXn_00261c50;
  local_170._8_2_ = 0;
  local_170._M_local_buf[10] = '\x03';
  md::Code::move(&local_e8,(Param *)&local_100,(Param *)local_180,WORD);
  local_180._0_8_ = &local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"next_loop_iteration","");
  md::Code::label(&local_e8,(string *)local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._0_8_ != &local_170) {
    operator_delete((void *)local_180._0_8_,local_170._M_allocated_capacity + 1);
  }
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261bb0;
  local_180._0_8_ = &local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"loop","");
  md::Code::dbra(&local_e8,(DataRegister *)&local_100,(string *)local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._0_8_ != &local_170) {
    operator_delete((void *)local_180._0_8_,local_170._M_allocated_capacity + 1);
  }
  local_180[8] = '\x03';
  local_180._0_8_ = &PTR_getXn_00261c50;
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 1;
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261c50;
  md::Code::move(&local_e8,(Param *)local_180,(Param *)&local_100,LONG);
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 1;
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261c50;
  local_180._0_8_ = &PTR_getXn_00261c98;
  local_180._8_8_ = 0x200000094;
  md::Code::adda(&local_e8,(Param *)local_180,(AddressRegister *)&local_100);
  local_180._0_8_ = &local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"line","");
  md::Code::bra(&local_e8,(string *)local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._0_8_ != &local_170) {
    operator_delete((void *)local_180._0_8_,local_170._M_allocated_capacity + 1);
  }
  local_180._0_8_ = &local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"ret","");
  md::Code::label(&local_e8,(string *)local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._0_8_ != &local_170) {
    operator_delete((void *)local_180._0_8_,local_170._M_allocated_capacity + 1);
  }
  local_180._8_8_ = local_180._8_8_ & 0xffffffffffffff00;
  local_180._0_8_ = &PTR_getXn_00261bb0;
  local_170._M_local_buf[8] = 1;
  local_170._M_allocated_capacity = (size_type)&PTR_getXn_00261bb0;
  local_158 = 2;
  local_160 = &PTR_getXn_00261bb0;
  local_148 = 3;
  local_150 = &PTR_getXn_00261bb0;
  local_138 = 4;
  local_140 = &PTR_getXn_00261bb0;
  local_128 = 5;
  local_130 = &PTR_getXn_00261bb0;
  local_118 = 6;
  local_120 = &PTR_getXn_00261bb0;
  local_108 = 7;
  local_110 = &PTR_getXn_00261bb0;
  __l_01._M_len = 8;
  __l_01._M_array = (iterator)local_180;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            (&local_100,__l_01,&local_181);
  local_50.super_Register._code = '\x03';
  local_50.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261c50;
  __l_02._M_len = 1;
  __l_02._M_array = &local_50;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            (&local_68,__l_02,&local_182);
  local_40.super_Register._code = '\a';
  local_40.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261c50;
  md::Code::movem(&local_e8,&local_100,&local_68,false,&local_40,LONG);
  if (local_68.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100.
                    super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_100.
                          super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_100.
                          super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  md::Code::rts(&local_e8);
  local_180._0_8_ = &local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"skip","");
  md::Code::label(&local_e8,(string *)local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._0_8_ != &local_170) {
    operator_delete((void *)local_180._0_8_,local_170._M_allocated_capacity + 1);
  }
  local_180[8] = '\x05';
  local_180._0_8_ = &PTR_getXn_00261bb0;
  md::Code::subq(&local_e8,'\x01',(Register *)local_180,WORD);
  local_180[8] = '\x01';
  local_180._0_8_ = &PTR_getXn_00261c50;
  md::Code::addq(&local_e8,'\x02',(Register *)local_180,LONG);
  local_180._0_8_ = &local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"next_loop_iteration","");
  md::Code::bra(&local_e8,(string *)local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._0_8_ != &local_170) {
    operator_delete((void *)local_180._0_8_,local_170._M_allocated_capacity + 1);
  }
  local_180._0_8_ = &local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"repeat","");
  md::Code::label(&local_e8,(string *)local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._0_8_ != &local_170) {
    operator_delete((void *)local_180._0_8_,local_170._M_allocated_capacity + 1);
  }
  local_180[8] = '\x04';
  local_180._0_8_ = &PTR_getXn_00261bb0;
  md::Code::subq(&local_e8,'\x01',(Register *)local_180,WORD);
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 6;
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261bb0;
  local_180._0_8_ = &PTR_getXn_00261d18;
  local_170._M_local_buf[0] = 1;
  local_180._8_8_ = &PTR_getXn_00261c50;
  local_170._8_2_ = 0;
  local_170._M_local_buf[10] = '\x03';
  md::Code::move(&local_e8,(Param *)&local_100,(Param *)local_180,WORD);
  local_180._0_8_ = &local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"next_loop_iteration","");
  md::Code::bra(&local_e8,(string *)local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._0_8_ != &local_170) {
    operator_delete((void *)local_180._0_8_,local_170._M_allocated_capacity + 1);
  }
  local_180._0_8_ = &local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"minus_case","");
  md::Code::label(&local_e8,(string *)local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._0_8_ != &local_170) {
    operator_delete((void *)local_180._0_8_,local_170._M_allocated_capacity + 1);
  }
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 7;
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261bb0;
  local_180._0_8_ = &PTR_getXn_00261c98;
  local_180._8_8_ = 0x100007fff;
  md::Code::andi(&local_e8,(ImmediateValue *)local_180,(Param *)&local_100,WORD);
  local_180._0_8_ = &local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"ret","");
  md::Code::beq(&local_e8,(string *)local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._0_8_ != &local_170) {
    operator_delete((void *)local_180._0_8_,local_170._M_allocated_capacity + 1);
  }
  local_180[8] = '\a';
  local_180._0_8_ = &PTR_getXn_00261bb0;
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 6;
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261bb0;
  md::Code::move(&local_e8,(Param *)local_180,(Param *)&local_100,WORD);
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 6;
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261bb0;
  local_180._0_8_ = &PTR_getXn_00261c98;
  local_180._8_8_ = 0x100000fff;
  md::Code::andi(&local_e8,(ImmediateValue *)local_180,(Param *)&local_100,WORD);
  local_180[8] = '\a';
  local_180._0_8_ = &PTR_getXn_00261bb0;
  md::Code::lsx(&local_e8,'\x04',(DataRegister *)local_180,true,LONG);
  local_180[8] = '\a';
  local_180._0_8_ = &PTR_getXn_00261bb0;
  md::Code::clr(&local_e8,(Param *)local_180,WORD);
  local_180[8] = '\a';
  local_180._0_8_ = &PTR_getXn_00261bb0;
  md::Code::swap(&local_e8,(DataRegister *)local_180);
  local_180._0_8_ = &local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"init_skip","");
  md::Code::beq(&local_e8,(string *)local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._0_8_ != &local_170) {
    operator_delete((void *)local_180._0_8_,local_170._M_allocated_capacity + 1);
  }
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 7;
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261bb0;
  local_180._0_8_ = &PTR_getXn_00261c98;
  local_180._8_8_ = 2;
  md::Code::cmpi(&local_e8,(ImmediateValue *)local_180,(Param *)&local_100,BYTE);
  local_180._0_8_ = &local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"init_repeat_byte","");
  md::Code::beq(&local_e8,(string *)local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._0_8_ != &local_170) {
    operator_delete((void *)local_180._0_8_,local_170._M_allocated_capacity + 1);
  }
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 7;
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261bb0;
  local_180._0_8_ = &PTR_getXn_00261c98;
  local_180._8_8_ = 1;
  md::Code::cmpi(&local_e8,(ImmediateValue *)local_180,(Param *)&local_100,BYTE);
  local_180._0_8_ = &local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"unpack_bytes","");
  md::Code::beq(&local_e8,(string *)local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._0_8_ != &local_170) {
    operator_delete((void *)local_180._0_8_,local_170._M_allocated_capacity + 1);
  }
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 7;
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261bb0;
  local_180._0_8_ = &PTR_getXn_00261c98;
  local_180._8_8_ = 5;
  md::Code::cmpi(&local_e8,(ImmediateValue *)local_180,(Param *)&local_100,BYTE);
  local_180._0_8_ = &local_170;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_180,"init_repeat_inverted_word","");
  md::Code::beq(&local_e8,(string *)local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._0_8_ != &local_170) {
    operator_delete((void *)local_180._0_8_,local_170._M_allocated_capacity + 1);
  }
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 7;
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261bb0;
  local_180._0_8_ = &PTR_getXn_00261c98;
  local_180._8_8_ = 6;
  md::Code::cmpi(&local_e8,(ImmediateValue *)local_180,(Param *)&local_100,BYTE);
  local_180._0_8_ = &local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"init_repeat_small_word","");
  md::Code::beq(&local_e8,(string *)local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._0_8_ != &local_170) {
    operator_delete((void *)local_180._0_8_,local_170._M_allocated_capacity + 1);
  }
  local_180._0_8_ = &local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"init_repeat_word","");
  md::Code::bra(&local_e8,(string *)local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._0_8_ != &local_170) {
    operator_delete((void *)local_180._0_8_,local_170._M_allocated_capacity + 1);
  }
  local_180._0_8_ = &local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"init_skip","");
  md::Code::label(&local_e8,(string *)local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._0_8_ != &local_170) {
    operator_delete((void *)local_180._0_8_,local_170._M_allocated_capacity + 1);
  }
  local_180[8] = '\x06';
  local_180._0_8_ = &PTR_getXn_00261bb0;
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 5;
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261bb0;
  md::Code::move(&local_e8,(Param *)local_180,(Param *)&local_100,WORD);
  local_180._0_8_ = &local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"skip","");
  md::Code::bra(&local_e8,(string *)local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._0_8_ != &local_170) {
    operator_delete((void *)local_180._0_8_,local_170._M_allocated_capacity + 1);
  }
  local_180._0_8_ = &local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"init_repeat_byte","");
  md::Code::label(&local_e8,(string *)local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._0_8_ != &local_170) {
    operator_delete((void *)local_180._0_8_,local_170._M_allocated_capacity + 1);
  }
  local_180[8] = '\x06';
  local_180._0_8_ = &PTR_getXn_00261bb0;
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 4;
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261bb0;
  md::Code::move(&local_e8,(Param *)local_180,(Param *)&local_100,WORD);
  local_180[8] = '\x04';
  local_180._0_8_ = &PTR_getXn_00261bb0;
  md::Code::lsx(&local_e8,'\b',(DataRegister *)local_180,false,WORD);
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 6;
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261bb0;
  local_180._0_8_ = &PTR_getXn_00261c98;
  local_180._8_8_ = 0x1000000ff;
  md::Code::andi(&local_e8,(ImmediateValue *)local_180,(Param *)&local_100,WORD);
  local_180._0_8_ = &local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"repeat","");
  md::Code::bra(&local_e8,(string *)local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._0_8_ != &local_170) {
    operator_delete((void *)local_180._0_8_,local_170._M_allocated_capacity + 1);
  }
  local_180._0_8_ = &local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"init_repeat_word","");
  md::Code::label(&local_e8,(string *)local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._0_8_ != &local_170) {
    operator_delete((void *)local_180._0_8_,local_170._M_allocated_capacity + 1);
  }
  local_180[8] = '\x06';
  local_180._0_8_ = &PTR_getXn_00261bb0;
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 4;
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261bb0;
  md::Code::move(&local_e8,(Param *)local_180,(Param *)&local_100,WORD);
  local_180._0_8_ = &PTR_getXn_00261d18;
  local_170._M_allocated_capacity = local_170._M_allocated_capacity & 0xffffffffffffff00;
  local_180._8_8_ = &PTR_getXn_00261c50;
  local_170._8_2_ = 0;
  local_170._M_local_buf[10] = '\x03';
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 6;
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261bb0;
  md::Code::move(&local_e8,(Param *)local_180,(Param *)&local_100,WORD);
  local_180._0_8_ = &local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"repeat","");
  md::Code::bra(&local_e8,(string *)local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._0_8_ != &local_170) {
    operator_delete((void *)local_180._0_8_,local_170._M_allocated_capacity + 1);
  }
  local_180._0_8_ = &local_170;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_180,"init_repeat_inverted_word","");
  md::Code::label(&local_e8,(string *)local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._0_8_ != &local_170) {
    operator_delete((void *)local_180._0_8_,local_170._M_allocated_capacity + 1);
  }
  local_180[8] = '\x06';
  local_180._0_8_ = &PTR_getXn_00261bb0;
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 4;
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261bb0;
  md::Code::move(&local_e8,(Param *)local_180,(Param *)&local_100,WORD);
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 4;
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261bb0;
  local_180._0_8_ = &PTR_getXn_00261c98;
  local_180._8_8_ = 0x10000000f;
  md::Code::andi(&local_e8,(ImmediateValue *)local_180,(Param *)&local_100,WORD);
  local_180[8] = '\x04';
  local_180._0_8_ = &PTR_getXn_00261bb0;
  md::Code::addq(&local_e8,'\x02',(Register *)local_180,BYTE);
  local_180[8] = '\x06';
  local_180._0_8_ = &PTR_getXn_00261bb0;
  md::Code::lsx(&local_e8,'\x04',(DataRegister *)local_180,true,WORD);
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 6;
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261bb0;
  local_180._0_8_ = &PTR_getXn_00261c98;
  local_180._8_8_ = 0x10000ff00;
  md::Code::andi(&local_e8,(ImmediateValue *)local_180,(Param *)&local_100,WORD);
  local_180._0_8_ = &local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"repeat","");
  md::Code::bra(&local_e8,(string *)local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._0_8_ != &local_170) {
    operator_delete((void *)local_180._0_8_,local_170._M_allocated_capacity + 1);
  }
  local_180._0_8_ = &local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"init_repeat_small_word","");
  md::Code::label(&local_e8,(string *)local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._0_8_ != &local_170) {
    operator_delete((void *)local_180._0_8_,local_170._M_allocated_capacity + 1);
  }
  local_180[8] = '\x06';
  local_180._0_8_ = &PTR_getXn_00261bb0;
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 4;
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261bb0;
  md::Code::move(&local_e8,(Param *)local_180,(Param *)&local_100,WORD);
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 4;
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261bb0;
  local_180._0_8_ = &PTR_getXn_00261c98;
  local_180._8_8_ = 0x100000003;
  md::Code::andi(&local_e8,(ImmediateValue *)local_180,(Param *)&local_100,WORD);
  local_180[8] = '\x04';
  local_180._0_8_ = &PTR_getXn_00261bb0;
  md::Code::addq(&local_e8,'\x02',(Register *)local_180,BYTE);
  local_180[8] = '\x06';
  local_180._0_8_ = &PTR_getXn_00261bb0;
  md::Code::lsx(&local_e8,'\x02',(DataRegister *)local_180,false,WORD);
  local_180._0_8_ = &local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"repeat","");
  md::Code::bra(&local_e8,(string *)local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._0_8_ != &local_170) {
    operator_delete((void *)local_180._0_8_,local_170._M_allocated_capacity + 1);
  }
  local_180._0_8_ = &local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"unpack_bytes","");
  md::Code::label(&local_e8,(string *)local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._0_8_ != &local_170) {
    operator_delete((void *)local_180._0_8_,local_170._M_allocated_capacity + 1);
  }
  local_180[8] = '\x06';
  local_180._0_8_ = &PTR_getXn_00261bb0;
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 7;
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261bb0;
  md::Code::move(&local_e8,(Param *)local_180,(Param *)&local_100,WORD);
  local_180[8] = '\x06';
  local_180._0_8_ = &PTR_getXn_00261bb0;
  md::Code::lsx(&local_e8,'\x06',(DataRegister *)local_180,false,WORD);
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 6;
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261bb0;
  local_180._0_8_ = &PTR_getXn_00261d18;
  local_170._M_local_buf[0] = 1;
  local_180._8_8_ = &PTR_getXn_00261c50;
  local_170._8_2_ = 0;
  local_170._M_local_buf[10] = '\x03';
  md::Code::move(&local_e8,(Param *)&local_100,(Param *)local_180,WORD);
  local_180[8] = '\x04';
  local_180._0_8_ = &PTR_getXn_00261bb0;
  md::Code::moveq(&local_e8,'\x01',(DataRegister *)local_180);
  local_180[8] = '\a';
  local_180._0_8_ = &PTR_getXn_00261bb0;
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 6;
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261bb0;
  md::Code::move(&local_e8,(Param *)local_180,(Param *)&local_100,WORD);
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 6;
  local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261bb0;
  local_180._0_8_ = &PTR_getXn_00261c98;
  local_180._8_8_ = 0x10000003f;
  md::Code::andi(&local_e8,(ImmediateValue *)local_180,(Param *)&local_100,WORD);
  local_180._0_8_ = &local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"next_loop_iteration","");
  md::Code::bra(&local_e8,(string *)local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._0_8_ != &local_170) {
    operator_delete((void *)local_180._0_8_,local_170._M_allocated_capacity + 1);
  }
  local_180._0_8_ = &local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"");
  uVar1 = md::ROM::inject_code(rom,&local_e8,(string *)local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._0_8_ != &local_170) {
    operator_delete((void *)local_180._0_8_,local_170._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&local_e8._labels._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_e8._pending_branches._M_t);
  if (local_e8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8._bytes.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return uVar1;
}

Assistant:

static uint32_t inject_func_load_data_block(md::ROM& rom)
    {
        md::Code func;
        func.movem_to_stack({ reg_D0_D7 }, { reg_A3 });

        func.adda(reg_D1, reg_A1); // advance to first non-empty line
        func.label("line");
        {
            // Store line starting address (A1) inside A3
            func.movel(reg_A1, reg_A3);
            {
                func.adda(reg_D2, reg_A1); // advance to first non-empty word in line
                func.movew(reg_D3, reg_D0); // setup the amount of words to copy inside D0

                // copy D0 words from A0 to A1, or until a 0xFFFF is found
                func.label("loop");
                {
                    // If there are still words to skip, skip it!
                    func.tstw(reg_D5);
                    func.bne("skip");
                    func.tstw(reg_D4);
                    func.bne("repeat");

                    func.movew(addr_postinc_(reg_A0), reg_D7);
                    func.bmi("minus_case");
                    func.movew(reg_D7, addr_postinc_(reg_A1));
                }
                func.label("next_loop_iteration");
                func.dbra(reg_D0, "loop");
            }
            func.movel(reg_A3, reg_A1);
            func.adda(LINE_SIZE_IN_BYTES, reg_A1); // advance to next line start
        }
        func.bra("line");

        func.label("ret");
        func.movem_from_stack({ reg_D0_D7 }, { reg_A3 });
        func.rts();

        // -----------------------------------------------
        // Code block handling the case where we need to skip iterations
        func.label("skip");
        {
            func.subqw(1, reg_D5);
            func.addql(2, reg_A1);
            func.bra("next_loop_iteration");
        }

        // -----------------------------------------------
        // Code block handling the case where we need to repeat data
        func.label("repeat");
        {
            func.subqw(1, reg_D4);
            func.movew(reg_D6, addr_postinc_(reg_A1));
            func.bra("next_loop_iteration");
        }

        // -----------------------------------------------
        // Code block handling the case where the msb is set
        func.label("minus_case");
        {
            func.andiw(0x7FFF, reg_D7); // Remove the topmost bit which is always set
            func.beq("ret");            // "10000000 00000000" case: end of block

            // Split the operand (D7) from the data (D6)
            func.movew(reg_D7, reg_D6);
            func.andiw(0x0FFF, reg_D6);
            func.lsll(4, reg_D7);
            func.clrw(reg_D7);
            func.swap(reg_D7);

            // Branch depending on the operand type
            func.beq("init_skip");                  // 0 --> 68710 usages
            func.cmpib(2, reg_D7);
            func.beq("init_repeat_byte");           // 2 --> 40787 usages
            func.cmpib(1, reg_D7);
            func.beq("unpack_bytes");               // 1 --> 30821 usages
            func.cmpib(5, reg_D7);
            func.beq("init_repeat_inverted_word");  // 5 --> 20744 usages
            func.cmpib(6, reg_D7);
            func.beq("init_repeat_small_word");     // 6 --> 16096 usages
            func.bra("init_repeat_word");           // 3 --> 114 usages
            //func.cmpib(3, reg_D7);
            //func.beq("init_repeat_word");
        }

        // -----------------------------------------------
        // 0 -> "1000AAAA AAAAAAAA" case: skip A words
        func.label("init_skip");
        {
            func.movew(reg_D6, reg_D5);  // Setup the amount of words to skip
            func.bra("skip");            // Start the skipping loop
        }

        // -----------------------------------------------
        // 2 -> "1010AAAA BBBBBBBB" case: repeat A times byte B
        func.label("init_repeat_byte");
        {
            // Setup amount of repeats (D4)
            func.movew(reg_D6, reg_D4);
            func.lsrw(8, reg_D4);
            // Setup word to repeat (D6)
            func.andiw(0x00FF, reg_D6);
            func.bra("repeat");            // Start the repeat loop
        }

        // -----------------------------------------------
        // 3 -> "1011AAAA AAAAAAAA" case: repeat next word A times
        func.label("init_repeat_word");
        {
            // Setup amount of repeats (D4)
            func.movew(reg_D6, reg_D4);
            // Setup word to repeat (D6)
            func.movew(addr_postinc_(reg_A0), reg_D6);
            func.bra("repeat");            // Start the repeat loop
        }

        // -----------------------------------------------
        // 5 -> "1101BBBB BBBBAAAA" case: repeat A+2 times byte B as an inverted word (0x26 >>> 0x2600)
        func.label("init_repeat_inverted_word");
        {
            // Setup amount of repeats (D4)
            func.movew(reg_D6, reg_D4);
            func.andiw(0x000F, reg_D4);
            func.addqb(2, reg_D4);
            // Setup word to repeat (D6)
            func.lslw(4, reg_D6);
            func.andiw(0xFF00, reg_D6);
            func.bra("repeat");     // Start the repeat loop
        }

        // -----------------------------------------------
        // 6 -> "1110WWWW WWWWWWXX" case: repeat 2+X times small word W
        func.label("init_repeat_small_word");
        {
            // Setup amount of repeats (D4)
            func.movew(reg_D6, reg_D4);
            func.andiw(0x0003, reg_D4);
            func.addqb(2, reg_D4);
            // Setup word to repeat (D6)
            func.lsrw(2, reg_D6);
            func.bra("repeat");     // Start the repeat loop
        }

        // -----------------------------------------------
        // 4 -> "1001AAAA AABBBBBB" case: place byte A then byte B as words
        func.label("unpack_bytes");
        {
            func.movew(reg_D6, reg_D7);
            func.lsrw(6, reg_D6);
            func.movew(reg_D6, addr_postinc_(reg_A1));
            // Setup a 1 occurence repeat to make the whole process handle line changes correctly
            func.moveq(1, reg_D4); // 1 repeat
            func.movew(reg_D7, reg_D6);
            func.andiw(0x003F, reg_D6);
            func.bra("next_loop_iteration");
        }

        return rom.inject_code(func);
    }